

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TableSortSpecsBuild(ImGuiTable *table)

{
  ImU64 *pIVar1;
  ImGuiTableSortSpecsColumn *pIVar2;
  ImGuiTableColumn *pIVar3;
  ImGuiTableSortSpecsColumn IVar4;
  ImGuiTableSortSpecsColumn *__dest;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  
  if (table->IsSortSpecsDirty == false) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x2811,"TableSortSpecsBuild","ImGui ASSERT FAILED: %s","table->IsSortSpecsDirty");
  }
  TableSortSpecsSanitize(table);
  iVar6 = (int)table->SortSpecsCount;
  iVar9 = (table->SortSpecsData).Capacity;
  if (iVar9 < iVar6) {
    if (iVar9 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar9 / 2 + iVar9;
    }
    if (iVar9 <= iVar6) {
      iVar9 = iVar6;
    }
    __dest = (ImGuiTableSortSpecsColumn *)MemAlloc((long)iVar9 << 3);
    pIVar2 = (table->SortSpecsData).Data;
    if (pIVar2 != (ImGuiTableSortSpecsColumn *)0x0) {
      memcpy(__dest,pIVar2,(long)(table->SortSpecsData).Size << 3);
      MemFree((table->SortSpecsData).Data);
    }
    (table->SortSpecsData).Data = __dest;
    (table->SortSpecsData).Capacity = iVar9;
  }
  (table->SortSpecsData).Size = iVar6;
  (table->SortSpecs).ColumnsMask = 0;
  if (0 < table->ColumnsCount) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      pIVar3 = (table->Columns).Data;
      if ((table->Columns).DataEnd <= (ImGuiTableColumn *)((long)&(pIVar3->ClipRect).Min.x + lVar7))
      {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                    ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
      }
      IVar4 = *(ImGuiTableSortSpecsColumn *)(&pIVar3->SortOrder + lVar7);
      iVar9 = (int)(char)IVar4;
      if (iVar9 != -1) {
        if ((table->SortSpecsData).Size <= iVar9) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
          IVar4 = *(ImGuiTableSortSpecsColumn *)(&pIVar3->SortOrder + lVar7);
        }
        lVar5 = (long)iVar9;
        pIVar2 = (table->SortSpecsData).Data;
        *(undefined4 *)(pIVar2 + lVar5 * 8) = *(undefined4 *)((long)&pIVar3->UserID + lVar7);
        pIVar2[lVar5 * 8 + 4] = SUB81(lVar8,0);
        pIVar2[lVar5 * 8 + 5] = IVar4;
        pIVar2[lVar5 * 8 + 6] = *(ImGuiTableSortSpecsColumn *)(&pIVar3->SortDirection + lVar7);
        pIVar1 = &(table->SortSpecs).ColumnsMask;
        *pIVar1 = *pIVar1 | 1L << ((byte)SUB81(lVar8,0) & 0x3f);
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x68;
    } while (lVar8 < table->ColumnsCount);
    iVar6 = (table->SortSpecsData).Size;
  }
  (table->SortSpecs).Specs = (table->SortSpecsData).Data;
  (table->SortSpecs).SpecsCount = iVar6;
  table->IsSortSpecsDirty = false;
  table->IsSortSpecsChangedForUser = true;
  return;
}

Assistant:

void ImGui::TableSortSpecsBuild(ImGuiTable* table)
{
    IM_ASSERT(table->IsSortSpecsDirty);
    TableSortSpecsSanitize(table);

    // Write output
    table->SortSpecsData.resize(table->SortSpecsCount);
    table->SortSpecs.ColumnsMask = 0x00;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->SortOrder == -1)
            continue;
        ImGuiTableSortSpecsColumn* sort_spec = &table->SortSpecsData[column->SortOrder];
        sort_spec->ColumnUserID = column->UserID;
        sort_spec->ColumnIndex = (ImU8)column_n;
        sort_spec->SortOrder = (ImU8)column->SortOrder;
        sort_spec->SortDirection = column->SortDirection;
        table->SortSpecs.ColumnsMask |= (ImU64)1 << column_n;
    }
    table->SortSpecs.Specs = table->SortSpecsData.Data;
    table->SortSpecs.SpecsCount = table->SortSpecsData.Size;

    table->IsSortSpecsDirty = false;
    table->IsSortSpecsChangedForUser = true;
}